

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::StringStreamToString(internal *this,stringstream *ss)

{
  size_t extraout_RDX;
  long lVar1;
  String SVar2;
  stringstream helper;
  char *local_1f8 [4];
  long local_1d8;
  long local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::stringstream(local_1b8);
  for (lVar1 = 0; local_1d0 != lVar1; lVar1 = lVar1 + 1) {
    if (*(char *)(local_1d8 + lVar1) == '\0') {
      std::operator<<(local_1a8,"\\0");
    }
    else {
      std::ostream::put((char)local_1a8);
    }
  }
  std::__cxx11::stringbuf::str();
  String::String((String *)this,local_1f8[0]);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  // We need to use a helper stringstream to do this transformation
  // because String doesn't support push_back().
  ::std::stringstream helper;
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      helper << "\\0";  // Replaces NUL with "\\0";
    } else {
      helper.put(*ch);
    }
  }

  return String(helper.str().c_str());
}